

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

locale * anon_unknown.dwarf_14c2e::path_locale(void)

{
  locale *plVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  undefined8 uVar3;
  
  iVar2 = CONCAT31((int3)((uint)in_EAX >> 8),(anonymous_namespace)::path_locale()::loc);
  if ((anonymous_namespace)::path_locale()::loc == '\0') {
    uVar3 = __cxa_guard_acquire(&(anonymous_namespace)::path_locale()::loc);
    in_register_00000004 = (undefined4)((ulong)uVar3 >> 0x20);
    iVar2 = (int)uVar3;
    if (iVar2 != 0) {
      std::locale::locale((locale *)&(anonymous_namespace)::path_locale()::loc,"");
      __cxa_atexit(std::locale::~locale,&(anonymous_namespace)::path_locale()::loc,&__dso_handle);
      plVar1 = (locale *)__cxa_guard_release(&(anonymous_namespace)::path_locale()::loc);
      return plVar1;
    }
  }
  return (locale *)CONCAT44(in_register_00000004,iVar2);
}

Assistant:

std::locale& path_locale()
  // std::locale("") construction, needed on non-Apple POSIX systems, can throw
  // (if environmental variables LC_MESSAGES or LANG are wrong, for example), so
  // path_locale() provides lazy initialization via a local static to ensure that any 
  // exceptions occur after main() starts and so can be caught. Furthermore,
  // path_locale() is only called if path::codecvt() or path::imbue() are themselves
  // actually called, ensuring that an exception will only be thrown if std::locale("")
  // is really needed.
  {
    // [locale] paragraph 6: Once a facet reference is obtained from a locale object by
    // calling use_facet<>, that reference remains usable, and the results from member
    // functions of it may be cached and re-used, as long as some locale object refers
    // to that facet.
    static std::locale loc(default_locale());
#ifdef BOOST_FILESYSTEM_DEBUG
    std::cout << "***** path_locale() called" << std::endl;
#endif
    return loc;
  }